

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O2

void __thiscall
Outputs::Display::BufferingScanTarget::set_modals(BufferingScanTarget *this,Modals modals)

{
  long lVar1;
  Modals *pMVar2;
  undefined8 *puVar3;
  byte bVar4;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  bVar4 = 0;
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_28._M_unused._M_object = operator_new(0x50);
  *(BufferingScanTarget **)local_28._M_unused._0_8_ = this;
  pMVar2 = &modals;
  puVar3 = (undefined8 *)((long)local_28._M_unused._0_8_ + 8);
  for (lVar1 = 0x44; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(char *)puVar3 = (char)pMVar2->input_data_type;
    pMVar2 = (Modals *)((long)pMVar2 + (ulong)bVar4 * -2 + 1);
    puVar3 = (undefined8 *)((long)puVar3 + (ulong)bVar4 * -2 + 1);
  }
  pcStack_10 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp:303:10)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Outputs/ScanTargets/BufferingScanTarget.cpp:303:10)>
             ::_M_manager;
  perform(this,(function<void_()> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void BufferingScanTarget::set_modals(Modals modals) {
	perform([=] {
		modals_ = modals;
		modals_are_dirty_.store(true, std::memory_order::memory_order_relaxed);
	});
}